

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

size_t __thiscall
PEFile::getExportsMap(PEFile *this,QMap<unsigned_long,_QString> *entrypoints,addr_type aType)

{
  int iVar1;
  size_type_conflict sVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  qsizetype qVar5;
  undefined4 extraout_var_00;
  size_type_conflict sVar6;
  ExportEntryWrapper *local_d0;
  long *local_c0;
  QString local_a0;
  unsigned_long local_88;
  offset_t offset;
  offset_t rva;
  undefined1 local_68 [8];
  QString forwarder;
  ExportEntryWrapper *entry;
  int i;
  size_t entriesCnt;
  ExportDirWrapper *exports;
  size_t initialSize;
  addr_type aType_local;
  QMap<unsigned_long,_QString> *entrypoints_local;
  PEFile *this_local;
  
  sVar2 = QMap<unsigned_long,_QString>::size(entrypoints);
  iVar1 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                    (&(this->super_MappedExe).super_ExeWrappersContainer,6);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_c0 = (long *)0x0;
  }
  else {
    local_c0 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar1),&ExeElementWrapper::typeinfo,
                                      &ExportDirWrapper::typeinfo,0);
  }
  if (local_c0 == (long *)0x0) {
    this_local = (PEFile *)0x0;
  }
  else {
    uVar3 = (**(code **)(*local_c0 + 0x108))();
    if (uVar3 == 0) {
      this_local = (PEFile *)0x0;
    }
    else {
      for (entry._4_4_ = 0; (ulong)(long)entry._4_4_ < uVar3; entry._4_4_ = entry._4_4_ + 1) {
        lVar4 = (**(code **)(*local_c0 + 0x100))(local_c0,(long)entry._4_4_);
        if (lVar4 == 0) {
          local_d0 = (ExportEntryWrapper *)0x0;
        }
        else {
          local_d0 = (ExportEntryWrapper *)
                     __dynamic_cast(lVar4,&ExeNodeWrapper::typeinfo,&ExportEntryWrapper::typeinfo,0)
          ;
        }
        forwarder.d.size = (qsizetype)local_d0;
        if (local_d0 != (ExportEntryWrapper *)0x0) {
          ExportEntryWrapper::getForwarderStr((QString *)local_68,local_d0);
          qVar5 = QString::length((QString *)local_68);
          if (qVar5 == 0) {
            offset = ExportEntryWrapper::getFuncRva((ExportEntryWrapper *)forwarder.d.size);
            iVar1 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                      _vptr_AbstractByteBuffer[0x17])(this,offset,2,(ulong)aType);
            local_88 = CONCAT44(extraout_var_00,iVar1);
            if (local_88 == 0xffffffffffffffff) {
              rva._0_4_ = 4;
            }
            else {
              (**(code **)(*(long *)forwarder.d.size + 0x70))(&local_a0);
              QMap<unsigned_long,_QString>::insert(entrypoints,&local_88,&local_a0);
              QString::~QString(&local_a0);
              rva._0_4_ = 0;
            }
          }
          else {
            rva._0_4_ = 4;
          }
          QString::~QString((QString *)local_68);
        }
      }
      sVar6 = QMap<unsigned_long,_QString>::size(entrypoints);
      this_local = (PEFile *)(sVar6 - sVar2);
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t PEFile::getExportsMap(QMap<offset_t,QString> &entrypoints, Executable::addr_type aType)
{
    size_t initialSize = entrypoints.size();

    ExportDirWrapper* exports = dynamic_cast<ExportDirWrapper*>(this->getWrapper(PEFile::WR_DIR_ENTRY + pe::DIR_EXPORT));
    if (!exports) return 0;
        
    const size_t entriesCnt = exports->getEntriesCount();
    if (entriesCnt == 0) return 0;

    for (int i = 0; i < entriesCnt; i++) {
        ExportEntryWrapper* entry = dynamic_cast<ExportEntryWrapper*>(exports->getEntryAt(i));
        if (!entry) continue;

        QString forwarder = entry->getForwarderStr();
        if (forwarder.length()) {
            continue;
        }
        offset_t rva = entry->getFuncRva();
        offset_t offset = this->convertAddr(rva, Executable::RVA, aType);
        if (offset == INVALID_ADDR) {
            continue;
        }
        entrypoints.insert(offset, entry->getName());
    }
    return entrypoints.size() - initialSize;
}